

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsocketnotifier.cpp
# Opt level: O3

void QSocketNotifier::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  undefined8 *puVar3;
  InterfaceType *pIVar4;
  int iVar5;
  long in_FS_OFFSET;
  undefined4 local_34;
  undefined1 local_2d;
  undefined4 local_2c;
  void *local_28;
  undefined4 *local_20;
  undefined4 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 0) {
      puVar3 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
LAB_002c7e40:
        pIVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QSocketDescriptor>::metaType;
      }
      else {
        if (*_a[1] != 1) goto LAB_002c7e37;
        pIVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QSocketNotifier::Type>::metaType;
      }
      *puVar3 = pIVar4;
    }
    else {
      if (_id == 1) {
        puVar3 = (undefined8 *)*_a;
        if (*_a[1] == 0) goto LAB_002c7e40;
      }
      else {
        puVar3 = (undefined8 *)*_a;
      }
LAB_002c7e37:
      *puVar3 = 0;
    }
  }
  else if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == activated && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == activated && lVar2 == 0) {
      *(undefined4 *)*_a = 2;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      local_2c = *_a[1];
      local_34 = *_a[2];
      local_10 = &local_2d;
      iVar5 = 0;
      break;
    case 1:
    case 2:
      local_2c = *_a[1];
      iVar5 = 2;
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        setEnabled((QSocketNotifier *)_o,*_a[1]);
        return;
      }
      goto LAB_002c7ec8;
    default:
      goto switchD_002c7d85_default;
    }
    local_18 = &local_34;
    local_20 = &local_2c;
    local_28 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar5,&local_28);
  }
switchD_002c7d85_default:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_002c7ec8:
  __stack_chk_fail();
}

Assistant:

void QSocketNotifier::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSocketNotifier *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->activated((*reinterpret_cast< std::add_pointer_t<QSocketDescriptor>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSocketNotifier::Type>>(_a[2])), QPrivateSignal()); break;
        case 1: _t->activated((*reinterpret_cast< std::add_pointer_t<QSocketDescriptor>>(_a[1])), QPrivateSignal()); break;
        case 2: _t->activated((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])), QPrivateSignal()); break;
        case 3: _t->setEnabled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSocketDescriptor >(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSocketNotifier::Type >(); break;
            }
            break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSocketDescriptor >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSocketNotifier::*)(QSocketDescriptor , QSocketNotifier::Type , QPrivateSignal)>(_a, &QSocketNotifier::activated, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSocketNotifier::*)(int , QPrivateSignal)>(_a, &QSocketNotifier::activated, 2))
            return;
    }
}